

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Bip32FormatType __thiscall
cfd::core::KeyFormatData::GetVersionFormatType(KeyFormatData *this,uint32_t version)

{
  Bip32FormatType BVar1;
  const_reference cVar2;
  CfdException *this_00;
  long lVar3;
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  allocator_type local_69;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&this->bip32_;
  local_50._M_string_length = (size_type)&this->bip49_;
  local_50.field_2._M_allocated_capacity = (size_type)&this->bip84_;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector(&cache_list,__l,&local_69);
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0xc) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_50,"unknown version.",(allocator *)&local_69);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    BVar1 = *(Bip32FormatType *)((long)&kFormatTypeList + lVar3);
    cVar2 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&this->has_format_,(ulong)BVar1);
    if ((cVar2) &&
       ((cache_list.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[BVar1]->pubkey_version == version ||
        (cache_list.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[BVar1]->privkey_version == version)))) break;
    lVar3 = lVar3 + 4;
  }
  ::std::
  _Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::~_Vector_base(&cache_list.
                   super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                 );
  return BVar1;
}

Assistant:

Bip32FormatType KeyFormatData::GetVersionFormatType(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return type;
      }
    }
  }
  throw CfdException(CfdError::kCfdIllegalArgumentError, "unknown version.");
}